

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O0

bool S2::GetIntersectionStableSorted<double>
               (Vector3<double> *a0,Vector3<double> *a1,Vector3<double> *b0,Vector3<double> *b1,
               Vector3<double> *result)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double local_1c8;
  Vector3<double> local_1c0;
  double local_1a8;
  double kMaxError;
  double x_len;
  double x_len2;
  double error;
  double T_ERR;
  Vector3<double> local_168;
  undefined1 local_150 [8];
  Vector3<double> x;
  double error_sum;
  double dist_sum;
  double b1_dist;
  double b0_dist;
  double b1_error;
  double b0_error;
  FloatType local_f0;
  double b_len;
  double a_norm_len;
  D local_c8;
  undefined1 local_b0 [8];
  Vector3<double> a_norm;
  S2LogMessage local_80;
  S2LogMessageVoidify local_69;
  D local_68;
  D local_50;
  Vector3<double> *local_38;
  Vector3<double> *result_local;
  Vector3<double> *b1_local;
  Vector3<double> *b0_local;
  Vector3<double> *a1_local;
  Vector3<double> *a0_local;
  
  local_38 = result;
  result_local = b1;
  b1_local = b0;
  b0_local = a1;
  a1_local = a0;
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            (&local_50,(BasicVector<Vector3,_double,_3UL> *)a1,a0);
  dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_50);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            (&local_68,(BasicVector<Vector3,_double,_3UL> *)result_local,b1_local);
  dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)&local_68);
  if (dVar3 <= dVar2) {
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
              (&local_c8,(BasicVector<Vector3,_double,_3UL> *)a1_local,b0_local);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
              ((D *)&a_norm_len,(BasicVector<Vector3,_double,_3UL> *)a1_local,b0_local);
    Vector3<double>::CrossProd((Vector3<double> *)local_b0,&local_c8,(Vector3<double> *)&a_norm_len)
    ;
    b_len = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                      ((BasicVector<Vector3,_double,_3UL> *)local_b0);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
              ((D *)&b0_error,(BasicVector<Vector3,_double,_3UL> *)result_local,b1_local);
    local_f0 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm
                         ((BasicVector<Vector3,_double,_3UL> *)&b0_error);
    b1_dist = GetProjection<double>
                        (b1_local,(Vector3<double> *)local_b0,b_len,a1_local,b0_local,&b1_error);
    dist_sum = GetProjection<double>
                         (result_local,(Vector3<double> *)local_b0,b_len,a1_local,b0_local,&b0_dist)
    ;
    dVar2 = ABS(b1_dist - dist_sum);
    x.c_[2] = b1_error + b0_dist;
    if (x.c_[2] < dVar2) {
      util::math::internal_vector::operator*
                (&local_168,&b1_dist,(BasicVector<Vector3,_double,_3UL> *)result_local);
      util::math::internal_vector::operator*
                ((Vector3<double> *)&T_ERR,&dist_sum,(BasicVector<Vector3,_double,_3UL> *)b1_local);
      util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
                ((D *)local_150,(BasicVector<Vector3,_double,_3UL> *)&local_168,(D *)&T_ERR);
      error = 1.1102230246251565e-16;
      x_len2 = (local_f0 * ABS(b1_dist * b0_dist - dist_sum * b1_error)) / (dVar2 - x.c_[2]) +
               dVar2 * 2.220446049250313e-16;
      dVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                        ((BasicVector<Vector3,_double,_3UL> *)local_150);
      x_len = dVar2;
      dVar3 = std::numeric_limits<double>::min();
      if (dVar3 <= dVar2) {
        kMaxError = sqrt(x_len);
        local_1a8 = S1Angle::radians((S1Angle *)&kIntersectionError);
        if (x_len2 <= kMaxError * 7.771561172376096e-16) {
          local_1c8 = 1.0 / kMaxError;
          util::math::internal_vector::operator*
                    (&local_1c0,&local_1c8,(BasicVector<Vector3,_double,_3UL> *)local_150);
          local_38->c_[0] = local_1c0.c_[0];
          local_38->c_[1] = local_1c0.c_[1];
          local_38->c_[2] = local_1c0.c_[2];
          a0_local._7_1_ = true;
        }
        else {
          a0_local._7_1_ = false;
        }
      }
      else {
        a0_local._7_1_ = false;
      }
    }
    else {
      a0_local._7_1_ = false;
    }
    return a0_local._7_1_;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crossings.cc"
             ,0xfe,kFatal,(ostream *)&std::cerr);
  poVar1 = S2LogMessage::stream(&local_80);
  poVar1 = std::operator<<(poVar1,"Check failed: ((a1 - a0).Norm2()) >= ((b1 - b0).Norm2()) ");
  S2LogMessageVoidify::operator&(&local_69,poVar1);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_80);
}

Assistant:

static bool GetIntersectionStableSorted(
    const Vector3<T>& a0, const Vector3<T>& a1,
    const Vector3<T>& b0, const Vector3<T>& b1, Vector3<T>* result) {
  S2_DCHECK_GE((a1 - a0).Norm2(), (b1 - b0).Norm2());

  // Compute the normal of the plane through (a0, a1) in a stable way.
  Vector3<T> a_norm = (a0 - a1).CrossProd(a0 + a1);
  T a_norm_len = a_norm.Norm();
  T b_len = (b1 - b0).Norm();

  // Compute the projection (i.e., signed distance) of b0 and b1 onto the
  // plane through (a0, a1).  Distances are scaled by the length of a_norm.
  T b0_error, b1_error;
  T b0_dist = GetProjection(b0, a_norm, a_norm_len, a0, a1, &b0_error);
  T b1_dist = GetProjection(b1, a_norm, a_norm_len, a0, a1, &b1_error);

  // The total distance from b0 to b1 measured perpendicularly to (a0,a1) is
  // |b0_dist - b1_dist|.  Note that b0_dist and b1_dist generally have
  // opposite signs because b0 and b1 are on opposite sides of (a0, a1).  The
  // code below finds the intersection point by interpolating along the edge
  // (b0, b1) to a fractional distance of b0_dist / (b0_dist - b1_dist).
  //
  // It can be shown that the maximum error in the interpolation fraction is
  //
  //     (b0_dist * b1_error - b1_dist * b0_error) /
  //        (dist_sum * (dist_sum - error_sum))
  //
  // We save ourselves some work by scaling the result and the error bound by
  // "dist_sum", since the result is normalized to be unit length anyway.
  T dist_sum = fabs(b0_dist - b1_dist);
  T error_sum = b0_error + b1_error;
  if (dist_sum <= error_sum) {
    return false;  // Error is unbounded in this case.
  }
  Vector3<T> x = b0_dist * b1 - b1_dist * b0;
  constexpr T T_ERR = s2pred::rounding_epsilon<T>();
  T error = b_len * fabs(b0_dist * b1_error - b1_dist * b0_error) /
      (dist_sum - error_sum) + 2 * T_ERR * dist_sum;

  // Finally we normalize the result, compute the corresponding error, and
  // check whether the total error is acceptable.
  T x_len2 = x.Norm2();
  if (x_len2 < std::numeric_limits<T>::min()) {
    // If x.Norm2() is less than the minimum normalized value of T, x_len might
    // lose precision and the result might fail to satisfy S2::IsUnitLength().
    // TODO(ericv): Implement S2::RobustNormalize().
    return false;
  }
  T x_len = sqrt(x_len2);
  const T kMaxError = kIntersectionError.radians();
  if (error > (kMaxError - T_ERR) * x_len) {
    return false;
  }
  *result = (1 / x_len) * x;
  return true;
}